

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

void anon_unknown.dwarf_13788b0::FinalizeFeatureFormat
               (string *format,string *activeTag,string *otherTag)

{
  ulong uVar1;
  
  uVar1 = std::__cxx11::string::find((char *)format,(ulong)(otherTag->_M_dataplus)._M_p,0);
  if (uVar1 != 0xffffffffffffffff) {
    std::__cxx11::string::find((char)format,0x7d);
    std::__cxx11::string::erase((ulong)format,uVar1);
  }
  uVar1 = std::__cxx11::string::find((char *)format,(ulong)(activeTag->_M_dataplus)._M_p,0);
  if (uVar1 != 0xffffffffffffffff) {
    std::__cxx11::string::erase((ulong)format,uVar1);
    uVar1 = std::__cxx11::string::find((char)format,0x7d);
    if (uVar1 != 0xffffffffffffffff) {
      std::__cxx11::string::erase((ulong)format,uVar1);
      return;
    }
  }
  return;
}

Assistant:

void FinalizeFeatureFormat(std::string& format, const std::string& activeTag,
                           const std::string& otherTag)
{
  auto pos = format.find(otherTag);
  if (pos != std::string::npos) {
    format.erase(pos, format.find('}', pos) - pos + 1);
  }
  pos = format.find(activeTag);
  if (pos != std::string::npos) {
    format.erase(pos, activeTag.length());
    pos = format.find('}', pos);
    if (pos != std::string::npos) {
      format.erase(pos, 1);
    }
  }
}